

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O1

bool __thiscall ev3dev::button::pressed(button *this)

{
  int iVar1;
  int iVar2;
  
  ioctl(((this->_fd).super___shared_ptr<ev3dev::button::file_descriptor,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->_fd,
        ((long)(this->_buf).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish -
        (long)(this->_buf).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_start) * 0x2000 | 0x80004518);
  iVar1 = this->_bit;
  iVar2 = iVar1 + 0x3f;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  return ((this->_buf).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2 >> 6] & (long)(1 << ((byte)iVar1 & 0x1f))) != 0;
}

Assistant:

bool button::pressed() const {
#ifndef NO_LINUX_HEADERS
    if (ioctl(*_fd, EVIOCGKEY(_buf.size()), _buf.data()) < 0) {
        // handle error
    }
#endif
    return (_buf[_bit / bits_per_long] & 1 << (_bit % bits_per_long));
}